

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_options.h
# Opt level: O2

bool __thiscall
draco::DracoOptions<draco::GeometryAttribute::Type>::GetAttributeBool
          (DracoOptions<draco::GeometryAttribute::Type> *this,AttributeKey *att_key,string *name,
          bool default_val)

{
  bool bVar1;
  DracoOptions<draco::GeometryAttribute::Type> *this_00;
  
  this_00 = (DracoOptions<draco::GeometryAttribute::Type> *)FindAttributeOptions(this,att_key);
  if (this_00 != (DracoOptions<draco::GeometryAttribute::Type> *)0x0) {
    bVar1 = Options::IsOptionSet((Options *)this_00,name);
    if (bVar1) goto LAB_00139386;
  }
  this_00 = this;
LAB_00139386:
  bVar1 = Options::GetBool(&this_00->global_options_,name,default_val);
  return bVar1;
}

Assistant:

bool DracoOptions<AttributeKeyT>::GetAttributeBool(const AttributeKeyT &att_key,
                                                   const std::string &name,
                                                   bool default_val) const {
  const Options *const att_options = FindAttributeOptions(att_key);
  if (att_options && att_options->IsOptionSet(name)) {
    return att_options->GetBool(name, default_val);
  }
  return global_options_.GetBool(name, default_val);
}